

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingQueue.h
# Opt level: O0

void __thiscall
Liby::BlockingQueue<std::function<void_()>_>::BlockingQueue
          (BlockingQueue<std::function<void_()>_> *this,
          initializer_list<std::function<void_()>_> elements)

{
  const_iterator pfVar1;
  function<void_()> *e;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<std::function<void_()>_> *__range2;
  BlockingQueue<std::function<void_()>_> *this_local;
  initializer_list<std::function<void_()>_> elements_local;
  
  elements_local._M_array = (iterator)elements._M_len;
  this_local = (BlockingQueue<std::function<void_()>_> *)elements._M_array;
  std::mutex::mutex(&this->mutex_);
  std::__cxx11::list<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::list
            (&this->queue_);
  std::condition_variable::condition_variable(&this->cond_);
  __end0 = std::initializer_list<std::function<void_()>_>::begin
                     ((initializer_list<std::function<void_()>_> *)&this_local);
  pfVar1 = std::initializer_list<std::function<void_()>_>::end
                     ((initializer_list<std::function<void_()>_> *)&this_local);
  for (; __end0 != pfVar1; __end0 = __end0 + 1) {
    std::__cxx11::list<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<std::function<void()>const&>
              ((list<std::function<void()>,std::allocator<std::function<void()>>> *)&this->queue_,
               __end0);
  }
  return;
}

Assistant:

BlockingQueue(std::initializer_list<T> elements = {}) {
        for (auto &e : elements) {
            queue_.emplace_back(e);
        }
    }